

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O2

_Bool cn_cbor_array_replace(cn_cbor *cb_array,cn_cbor *cb_value,int index,cn_cbor_errback *errp)

{
  _Bool _Var1;
  cn_cbor *pcVar2;
  cn_cbor *pcVar3;
  cn_cbor **ppcVar4;
  int iVar5;
  
  if ((cb_value == (cn_cbor *)0x0 || cb_array == (cn_cbor *)0x0) ||
     (cb_array->type != CN_CBOR_ARRAY)) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
    }
    return false;
  }
  if (index == 0) {
    if (cb_array->length < 1) {
      _Var1 = cn_cbor_array_append(cb_array,cb_value,errp);
      return _Var1;
    }
    pcVar3 = cb_array->first_child;
    cb_value->parent = cb_array;
    ppcVar4 = &pcVar3->next;
    cb_value->next = pcVar3->next;
    if (cb_array->last_child == pcVar3) {
      cb_array->last_child = cb_value;
    }
    cb_array->first_child = cb_value;
  }
  else {
    pcVar2 = cb_array->first_child;
    if (pcVar2 == (cn_cbor *)0x0) {
      if (errp != (cn_cbor_errback *)0x0) {
        errp->err = CN_CBOR_NO_ERROR;
      }
      pcVar2 = (cn_cbor *)calloc(1,0x38);
      if (pcVar2 == (cn_cbor *)0x0) {
LAB_00183976:
        if (errp == (cn_cbor_errback *)0x0) {
          return false;
        }
        errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
        return false;
      }
      cb_array->last_child = pcVar2;
      cb_array->first_child = pcVar2;
      pcVar2->parent = cb_array;
      cb_array->length = 1;
      pcVar2->type = CN_CBOR_INVALID;
    }
    for (iVar5 = 1; pcVar3 = pcVar2->next, iVar5 < index; iVar5 = iVar5 + 1) {
      if (pcVar3 == (cn_cbor *)0x0) {
        if (errp != (cn_cbor_errback *)0x0) {
          errp->err = CN_CBOR_NO_ERROR;
        }
        pcVar3 = (cn_cbor *)calloc(1,0x38);
        if (pcVar3 == (cn_cbor *)0x0) goto LAB_00183976;
        pcVar3->type = CN_CBOR_INVALID;
        pcVar2->next = pcVar3;
        pcVar3->parent = cb_array;
        cb_array->last_child = pcVar3;
        cb_array->length = cb_array->length + 1;
        pcVar3 = pcVar2->next;
      }
      pcVar2 = pcVar3;
    }
    if (pcVar3 == (cn_cbor *)0x0) {
      pcVar2->next = cb_value;
      cb_value->parent = cb_array;
      cb_array->last_child = cb_value;
      cb_array->length = cb_array->length + 1;
      return true;
    }
    ppcVar4 = &pcVar3->next;
    cb_value->next = pcVar3->next;
    pcVar2->next = cb_value;
    cb_value->parent = cb_array;
    if (cb_array->last_child == pcVar3) {
      cb_array->last_child = cb_value;
    }
  }
  *ppcVar4 = (cn_cbor *)0x0;
  ppcVar4[1] = (cn_cbor *)0x0;
  cn_cbor_free(pcVar3);
  return true;
}

Assistant:

bool cn_cbor_array_replace(cn_cbor * cb_array, cn_cbor * cb_value, int index, CBOR_CONTEXT_COMMA cn_cbor_errback *errp)
{
	int i;
	cn_cbor * cb_temp;
	cn_cbor * cb_temp2;

	if (!cb_array || !cb_value || cb_array->type != CN_CBOR_ARRAY) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
		return false;
	}

	if (index == 0) {
		if (cb_array->length > 0) {
			cb_temp = cb_array->first_child;

			cb_value->parent = cb_array;
			cb_value->next = cb_temp->next;
			if (cb_array->last_child == cb_temp) {
				cb_array->last_child = cb_value;
			}
			cb_array->first_child = cb_value;
			cb_temp->parent = NULL;
			cb_temp->next = NULL;
			cn_cbor_free(cb_temp CBOR_CONTEXT_PARAM);
			return true;
		}
		return cn_cbor_array_append(cb_array, cb_value, errp);
	}

	if (cb_array->first_child == NULL) {
		INIT_CB(cb_temp2);
		cb_array->first_child = cb_array->last_child = cb_temp2;
		cb_temp2->parent = cb_array;
		cb_array->length = 1;
		cb_temp2->type = CN_CBOR_INVALID;
	}

	cb_temp = cb_array->first_child;
	for (i = 1; i < index; i++) {
		if (cb_temp->next == NULL) {
			INIT_CB(cb_temp2);
			cb_temp2->type = CN_CBOR_INVALID;
			cb_temp->next = cb_temp2;
			cb_temp2->parent = cb_array;
			cb_array->last_child = cb_temp2;
			cb_array->length += 1;
		}

		cb_temp = cb_temp->next;
	}

	if (cb_temp->next == NULL) {
		cb_temp->next = cb_value;
		cb_value->parent = cb_array;
		cb_array->last_child = cb_value;
		cb_array->length += 1;
		return true;
	}

	cb_temp2 = cb_temp->next;
	cb_value->next = cb_temp2->next;
	cb_temp->next = cb_value;
	cb_value->parent = cb_array;
	if (cb_array->last_child == cb_temp2) {
		cb_array->last_child = cb_value;
	}

	cb_temp2->next = NULL;
	cb_temp2->parent = NULL;
	cn_cbor_free(cb_temp2 CBOR_CONTEXT_PARAM);

	return true;
}